

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O1

int av1_alloc_above_context_buffers
              (CommonContexts *above_contexts,int num_tile_rows,int num_mi_cols,int num_planes)

{
  ENTROPY_CONTEXT **ppEVar1;
  PARTITION_CONTEXT **ppPVar2;
  TXFM_CONTEXT **ppTVar3;
  ENTROPY_CONTEXT *pEVar4;
  PARTITION_CONTEXT *pPVar5;
  TXFM_CONTEXT *pTVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  
  uVar11 = num_mi_cols + 0x1fU & 0xffffffe0;
  above_contexts->num_tile_rows = num_tile_rows;
  above_contexts->num_mi_cols = uVar11;
  above_contexts->num_planes = num_planes;
  sVar9 = (size_t)num_tile_rows;
  if (0 < num_planes) {
    uVar7 = 0;
    do {
      ppEVar1 = (ENTROPY_CONTEXT **)aom_calloc(sVar9,8);
      above_contexts->entropy[uVar7] = ppEVar1;
      if (ppEVar1 == (ENTROPY_CONTEXT **)0x0) {
        return 1;
      }
      uVar7 = uVar7 + 1;
    } while ((uint)num_planes != uVar7);
  }
  ppPVar2 = (PARTITION_CONTEXT **)aom_calloc(sVar9,8);
  above_contexts->partition = ppPVar2;
  uVar10 = 1;
  if (ppPVar2 != (PARTITION_CONTEXT **)0x0) {
    ppTVar3 = (TXFM_CONTEXT **)aom_calloc(sVar9,8);
    above_contexts->txfm = ppTVar3;
    if (ppTVar3 != (TXFM_CONTEXT **)0x0) {
      bVar12 = 0 < num_tile_rows;
      if (0 < num_tile_rows) {
        sVar9 = (size_t)(int)uVar11;
        uVar7 = 0;
        do {
          if (0 < num_planes) {
            uVar8 = 0;
            do {
              pEVar4 = (ENTROPY_CONTEXT *)aom_calloc(sVar9,1);
              above_contexts->entropy[uVar8][uVar7] = pEVar4;
              if (above_contexts->entropy[uVar8][uVar7] == (ENTROPY_CONTEXT *)0x0)
              goto LAB_0038913c;
              uVar8 = uVar8 + 1;
            } while ((uint)num_planes != uVar8);
          }
          pPVar5 = (PARTITION_CONTEXT *)aom_calloc(sVar9,1);
          above_contexts->partition[uVar7] = pPVar5;
          if (above_contexts->partition[uVar7] == (PARTITION_CONTEXT *)0x0) break;
          pTVar6 = (TXFM_CONTEXT *)aom_calloc(sVar9,1);
          above_contexts->txfm[uVar7] = pTVar6;
          if (above_contexts->txfm[uVar7] == (TXFM_CONTEXT *)0x0) break;
          uVar7 = uVar7 + 1;
          bVar12 = uVar7 < (uint)num_tile_rows;
        } while (uVar7 != (uint)num_tile_rows);
      }
LAB_0038913c:
      uVar10 = (uint)bVar12;
    }
  }
  return uVar10;
}

Assistant:

int av1_alloc_above_context_buffers(CommonContexts *above_contexts,
                                    int num_tile_rows, int num_mi_cols,
                                    int num_planes) {
  const int aligned_mi_cols =
      ALIGN_POWER_OF_TWO(num_mi_cols, MAX_MIB_SIZE_LOG2);

  // Allocate above context buffers
  above_contexts->num_tile_rows = num_tile_rows;
  above_contexts->num_mi_cols = aligned_mi_cols;
  above_contexts->num_planes = num_planes;
  for (int plane_idx = 0; plane_idx < num_planes; plane_idx++) {
    above_contexts->entropy[plane_idx] = (ENTROPY_CONTEXT **)aom_calloc(
        num_tile_rows, sizeof(above_contexts->entropy[0]));
    if (!above_contexts->entropy[plane_idx]) return 1;
  }

  above_contexts->partition = (PARTITION_CONTEXT **)aom_calloc(
      num_tile_rows, sizeof(above_contexts->partition));
  if (!above_contexts->partition) return 1;

  above_contexts->txfm =
      (TXFM_CONTEXT **)aom_calloc(num_tile_rows, sizeof(above_contexts->txfm));
  if (!above_contexts->txfm) return 1;

  for (int tile_row = 0; tile_row < num_tile_rows; tile_row++) {
    for (int plane_idx = 0; plane_idx < num_planes; plane_idx++) {
      above_contexts->entropy[plane_idx][tile_row] =
          (ENTROPY_CONTEXT *)aom_calloc(
              aligned_mi_cols, sizeof(*above_contexts->entropy[0][tile_row]));
      if (!above_contexts->entropy[plane_idx][tile_row]) return 1;
    }

    above_contexts->partition[tile_row] = (PARTITION_CONTEXT *)aom_calloc(
        aligned_mi_cols, sizeof(*above_contexts->partition[tile_row]));
    if (!above_contexts->partition[tile_row]) return 1;

    above_contexts->txfm[tile_row] = (TXFM_CONTEXT *)aom_calloc(
        aligned_mi_cols, sizeof(*above_contexts->txfm[tile_row]));
    if (!above_contexts->txfm[tile_row]) return 1;
  }

  return 0;
}